

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * next_option(char *list,vec *val,vec *eq_val)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (val == (vec *)0x0) {
LAB_00118408:
    list = (char *)0x0;
  }
  else {
    do {
      if ((list == (char *)0x0) || (cVar2 = *list, pcVar6 = list, cVar2 == '\0')) goto LAB_00118408;
      while ((cVar2 == ' ' || (cVar2 == '\t'))) {
        list = list + 1;
        cVar2 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      }
      val->ptr = pcVar6;
      pcVar3 = strchr(pcVar6,0x2c);
      if (pcVar3 == (char *)0x0) {
        sVar4 = strlen(pcVar6);
        list = pcVar6 + sVar4;
        val->len = sVar4;
      }
      else {
        sVar4 = (long)pcVar3 - (long)list;
        val->len = sVar4;
        list = pcVar3 + 1;
      }
      if (0 < (int)(uint)sVar4) {
        uVar5 = (ulong)((uint)sVar4 & 0x7fffffff);
        do {
          if ((pcVar6[uVar5 - 1] != '\t') && (pcVar6[uVar5 - 1] != ' ')) {
            val->len = uVar5 & 0xffffffff;
            goto LAB_00118412;
          }
          sVar4 = uVar5 - 1;
          bVar1 = 1 < uVar5;
          uVar5 = sVar4;
        } while (bVar1);
      }
      val->len = (long)(int)sVar4;
    } while ((int)sVar4 == 0);
LAB_00118412:
    if (eq_val != (vec *)0x0) {
      eq_val->len = 0;
      sVar4 = val->len;
      pcVar6 = (char *)memchr(pcVar6,0x3d,sVar4);
      eq_val->ptr = pcVar6;
      if (pcVar6 != (char *)0x0) {
        eq_val->ptr = pcVar6 + 1;
        pcVar3 = val->ptr;
        eq_val->len = (size_t)(pcVar3 + (sVar4 - (long)(pcVar6 + 1)));
        val->len = (size_t)(pcVar6 + ~(ulong)pcVar3 + 1);
      }
    }
  }
  return list;
}

Assistant:

static const char *
next_option(const char *list, struct vec *val, struct vec *eq_val)
{
	int end;

reparse:
	if (val == NULL || list == NULL || *list == '\0') {
		/* End of the list */
		return NULL;
	}

	/* Skip over leading LWS */
	while (*list == ' ' || *list == '\t')
		list++;

	val->ptr = list;
	if ((list = strchr(val->ptr, ',')) != NULL) {
		/* Comma found. Store length and shift the list ptr */
		val->len = ((size_t)(list - val->ptr));
		list++;
	} else {
		/* This value is the last one */
		list = val->ptr + strlen(val->ptr);
		val->len = ((size_t)(list - val->ptr));
	}

	/* Adjust length for trailing LWS */
	end = (int)val->len - 1;
	while (end >= 0 && ((val->ptr[end] == ' ') || (val->ptr[end] == '\t')))
		end--;
	val->len = (size_t)(end) + (size_t)(1);

	if (val->len == 0) {
		/* Ignore any empty entries. */
		goto reparse;
	}

	if (eq_val != NULL) {
		/* Value has form "x=y", adjust pointers and lengths
		 * so that val points to "x", and eq_val points to "y". */
		eq_val->len = 0;
		eq_val->ptr = (const char *)memchr(val->ptr, '=', val->len);
		if (eq_val->ptr != NULL) {
			eq_val->ptr++; /* Skip over '=' character */
			eq_val->len = ((size_t)(val->ptr - eq_val->ptr)) + val->len;
			val->len = ((size_t)(eq_val->ptr - val->ptr)) - 1;
		}
	}

	return list;
}